

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O3

string * __thiscall
VulkanUtilities::VkAccessFlagsToString_abi_cxx11_
          (string *__return_storage_ptr__,VulkanUtilities *this,VkAccessFlags Flags)

{
  size_type sVar1;
  VkAccessFlagBits VVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)this != 0) {
    uVar3 = (ulong)this & 0xffffffff;
    sVar1 = 0;
    while( true ) {
      if (sVar1 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      VVar2 = (VkAccessFlagBits)uVar3;
      VkAccessFlagBitToString(-VVar2 & VVar2);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      VVar2 = VVar2 & VVar2 - VK_ACCESS_INDIRECT_COMMAND_READ_BIT;
      uVar3 = (ulong)VVar2;
      if (VVar2 == VK_ACCESS_NONE) break;
      sVar1 = __return_storage_ptr__->_M_string_length;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VkAccessFlagsToString(VkAccessFlags Flags)
{
    std::string FlagsString;
    while (Flags != 0)
    {
        auto Bit = Flags & ~(Flags - 1);
        if (!FlagsString.empty())
            FlagsString += ", ";
        FlagsString += VkAccessFlagBitToString(static_cast<VkAccessFlagBits>(Bit));
        Flags = Flags & (Flags - 1);
    }
    return FlagsString;
}